

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Real __thiscall Omega_h::Mesh::imbalance(Mesh *this,Int ent_dim)

{
  LO LVar1;
  I32 IVar2;
  double dVar3;
  Real RVar4;
  double dVar5;
  
  if (ent_dim == -1) {
    ent_dim = dim(this);
  }
  LVar1 = nents(this,ent_dim);
  dVar3 = Comm::allreduce<double>
                    ((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(double)LVar1,OMEGA_H_SUM);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar5 = Comm::allreduce<double>
                      ((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(double)LVar1,OMEGA_H_MAX);
    IVar2 = Comm::size((this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    RVar4 = dVar5 / (dVar3 / (double)IVar2);
  }
  else {
    RVar4 = 1.0;
  }
  return RVar4;
}

Assistant:

Real Mesh::imbalance(Int ent_dim) const {
  if (ent_dim == -1) ent_dim = dim();
  auto local = Real(nents(ent_dim));
  auto s = comm_->allreduce(local, OMEGA_H_SUM);
  if (s == 0.0) return 1.0;
  auto m = comm_->allreduce(local, OMEGA_H_MAX);
  auto n = comm_->size();
  auto a = s / n;
  return m / a;
}